

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

int Sbl_ManComputeDelay(Sbl_Man_t *p,int iLut,Vec_Int_t *vFanins)

{
  int iVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vFanins->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vFanins,i);
    iVar1 = Vec_IntEntry(p->vArrs,iVar1);
    if (iVar2 <= iVar1 + 1) {
      iVar2 = iVar1 + 1;
    }
  }
  return iVar2;
}

Assistant:

int Sbl_ManComputeDelay( Sbl_Man_t * p, int iLut, Vec_Int_t * vFanins )
{
    int k, iFan, Delay = 0;
    Vec_IntForEachEntry( vFanins, iFan, k )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vArrs, iFan) + 1 );
    return Delay;
}